

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nap_communicate.hpp
# Opt level: O0

char * MPIX_NAP_unpack(char *packed_buf,int size,MPI_Datatype datatype,MPI_Comm comm)

{
  char *pcVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  int in_ESI;
  undefined8 in_RDI;
  ulong uVar2;
  char *unpacked_buf;
  int ctr;
  int pack_size;
  int type_size;
  undefined4 local_2c;
  undefined4 local_28;
  int local_24;
  undefined8 local_20;
  undefined8 local_18;
  int local_c;
  undefined8 local_8;
  
  local_2c = 0;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  MPI_Type_size(in_RDX,&local_24);
  uVar2 = (ulong)(local_c * local_24);
  if ((long)uVar2 < 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pcVar1 = (char *)operator_new__(uVar2);
  MPI_Pack_size(local_c,local_18,local_20,&local_28);
  MPI_Unpack(local_8,local_28,&local_2c,pcVar1,local_c,local_18,local_20);
  return pcVar1;
}

Assistant:

static char* MPIX_NAP_unpack(char* packed_buf, int size, MPI_Datatype datatype, MPI_Comm comm)
{
    int type_size, pack_size;
    int ctr = 0;

    MPI_Type_size(datatype, &type_size);
    char* unpacked_buf = new char[size*type_size];

    MPI_Pack_size(size, datatype, comm, &pack_size);
    MPI_Unpack(packed_buf, pack_size, &ctr, unpacked_buf, size, datatype, comm);

    return unpacked_buf;
}